

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIFloatDecoder::decode(FIFloatDecoder *this,uint8_t *data,size_t len)

{
  uint uVar1;
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar2;
  undefined1 local_78 [16];
  value_type_conflict6 local_68;
  value_type_conflict6 local_64;
  float f;
  int v;
  size_t i;
  size_t numFloats;
  vector<float,_std::allocator<float>_> value;
  size_t len_local;
  uint8_t *data_local;
  FIFloatDecoder *this_local;
  
  if ((in_RCX & 3) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&numFloats);
  i = in_RCX >> 2;
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)&numFloats,i);
  len_local = len;
  for (_f = (pointer)0x0; _f < i; _f = (pointer)((long)_f + 1)) {
    uVar1 = *(uint *)len_local;
    local_68 = (value_type_conflict6)
               (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
    local_64 = local_68;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&numFloats,&local_68);
    len_local = len_local + 4;
  }
  FIFloatValue::create((FIFloatValue *)local_78,(vector<float,_std::allocator<float>_> *)&numFloats)
  ;
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIFloatValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FIFloatValue> *)local_78)
  ;
  std::shared_ptr<Assimp::FIFloatValue>::~shared_ptr((shared_ptr<Assimp::FIFloatValue> *)local_78);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&numFloats);
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 3) {
            throw DeadlyImportError(parseErrorMessage);
        }
        std::vector<float> value;
        size_t numFloats = len / 4;
        value.reserve(numFloats);
        for (size_t i = 0; i < numFloats; ++i) {
            int v = (data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3];
            float f;
            memcpy(&f, &v, 4);
            value.push_back(f);
            data += 4;
        }
        return FIFloatValue::create(std::move(value));
    }